

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void deqp::gls::ub::anon_unknown_12::generateCompareSrc
               (ostringstream *src,char *resultVar,VarType *type,char *srcName,char *apiName,
               UniformLayout *layout,void *basePtr,deUint32 unusedMask)

{
  VarType *pVVar1;
  UniformLayout *pUVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  VarType *pVVar9;
  ulong *puVar10;
  ulong uVar11;
  int iVar12;
  UniformLayoutEntry *entry;
  long lVar13;
  string op_1;
  undefined4 in_stack_fffffffffffffd9c;
  deUint32 in_stack_fffffffffffffda0;
  allocator<char> local_25a;
  allocator<char> local_259;
  VarType *local_258;
  long local_250;
  undefined1 local_248 [24];
  undefined8 local_230;
  long local_228;
  undefined8 uStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  VarType *local_1d8;
  UniformLayout *local_1d0;
  UniformLayout *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  VarType *local_1a8;
  long local_1a0;
  VarType local_198 [4];
  ios_base local_138 [264];
  
  iVar12 = *(int *)resultVar;
  local_1d8 = type;
  local_1d0 = layout;
  local_1c8 = (UniformLayout *)apiName;
  local_1c0 = srcName;
  if (iVar12 != 0) {
    if (iVar12 != 1) {
      lVar13 = *(long *)(*(long *)(resultVar + 8) + 0x20);
      if (lVar13 == *(long *)(*(long *)(resultVar + 8) + 0x28)) {
        return;
      }
      local_1b0 = resultVar;
      do {
        if ((*(uint *)(lVar13 + 0x38) & (uint)basePtr) == 0) {
          local_258 = (VarType *)local_248;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,".","");
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
          pVVar9 = (VarType *)(plVar5 + 2);
          if ((VarType *)*plVar5 == pVVar9) {
            local_198[0].m_type = pVVar9->m_type;
            local_198[0].m_flags = pVVar9->m_flags;
            local_198[0].m_data._0_8_ = plVar5[3];
            local_1a8 = local_198;
          }
          else {
            local_198[0].m_type = pVVar9->m_type;
            local_198[0].m_flags = pVVar9->m_flags;
            local_1a8 = (VarType *)*plVar5;
          }
          local_1a0 = plVar5[1];
          *plVar5 = (long)pVVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if (local_258 != (VarType *)local_248) {
            operator_delete(local_258,local_248._0_8_ + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_248 + 0x10),(char *)local_1d8,&local_259);
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)(local_248 + 0x10),(ulong)local_1a8);
          pVVar9 = (VarType *)(plVar5 + 2);
          if ((VarType *)*plVar5 == pVVar9) {
            local_248._0_4_ = pVVar9->m_type;
            local_248._4_4_ = pVVar9->m_flags;
            local_248._8_8_ = plVar5[3];
            local_258 = (VarType *)local_248;
          }
          else {
            local_248._0_4_ = pVVar9->m_type;
            local_248._4_4_ = pVVar9->m_flags;
            local_258 = (VarType *)*plVar5;
          }
          pVVar1 = local_258;
          local_250 = plVar5[1];
          *plVar5 = (long)pVVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,local_1c0,&local_25a);
          plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1a8);
          local_218 = &local_208;
          puVar10 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar10) {
            local_208 = *puVar10;
            lStack_200 = plVar5[3];
          }
          else {
            local_208 = *puVar10;
            local_218 = (ulong *)*plVar5;
          }
          local_210 = plVar5[1];
          *plVar5 = (long)puVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          generateCompareSrc(src,(char *)(lVar13 + 0x20),pVVar1,(char *)local_218,(char *)local_1c8,
                             local_1d0,(void *)CONCAT44(in_stack_fffffffffffffd9c,(uint)basePtr),
                             in_stack_fffffffffffffda0);
          if (local_218 != &local_208) {
            operator_delete(local_218,local_208 + 1);
          }
          if (local_1f8 != local_1e8) {
            operator_delete(local_1f8,local_1e8[0] + 1);
          }
          if (local_258 != (VarType *)local_248) {
            operator_delete(local_258,local_248._0_8_ + 1);
          }
          if ((long *)local_248._16_8_ != &local_228) {
            operator_delete((void *)local_248._16_8_,local_228 + 1);
          }
          resultVar = local_1b0;
          if (local_1a8 != local_198) {
            operator_delete(local_1a8,local_198[0]._0_8_ + 1);
            resultVar = local_1b0;
          }
        }
        lVar13 = lVar13 + 0x40;
      } while (lVar13 != *(long *)(*(long *)(resultVar + 8) + 0x28));
      return;
    }
    if (**(int **)(resultVar + 8) != 0) {
      if (*(int *)(resultVar + 0x10) < 1) {
        return;
      }
      local_1b8 = *(char **)(resultVar + 8);
      iVar12 = 0;
      do {
        local_218 = &local_208;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"[","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar12);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_218 != &local_208) {
          uVar11 = local_208;
        }
        if (uVar11 < (ulong)(local_1f0 + local_210)) {
          uVar11 = 0xf;
          if (local_1f8 != local_1e8) {
            uVar11 = local_1e8[0];
          }
          if (uVar11 < (ulong)(local_1f0 + local_210)) goto LAB_0188eb9b;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_218);
        }
        else {
LAB_0188eb9b:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1f8);
        }
        local_248._16_8_ = &local_228;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_228 = *plVar5;
          uStack_220 = puVar4[3];
        }
        else {
          local_228 = *plVar5;
          local_248._16_8_ = (long *)*puVar4;
        }
        local_230 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append(local_248 + 0x10);
        pVVar9 = (VarType *)(plVar5 + 2);
        if ((VarType *)*plVar5 == pVVar9) {
          local_248._0_4_ = pVVar9->m_type;
          local_248._4_4_ = pVVar9->m_flags;
          local_248._8_8_ = plVar5[3];
          local_258 = (VarType *)local_248;
        }
        else {
          local_248._0_4_ = pVVar9->m_type;
          local_248._4_4_ = pVVar9->m_flags;
          local_258 = (VarType *)*plVar5;
        }
        local_250 = plVar5[1];
        *plVar5 = (long)pVVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((long *)local_248._16_8_ != &local_228) {
          operator_delete((void *)local_248._16_8_,local_228 + 1);
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        if (local_218 != &local_208) {
          operator_delete(local_218,local_208 + 1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_248 + 0x10),(char *)local_1d8,&local_259);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)(local_248 + 0x10),(ulong)local_258);
        local_1a8 = local_198;
        pVVar9 = (VarType *)(plVar5 + 2);
        if ((VarType *)*plVar5 == pVVar9) {
          local_198[0].m_type = pVVar9->m_type;
          local_198[0].m_flags = pVVar9->m_flags;
          local_198[0].m_data._0_8_ = plVar5[3];
        }
        else {
          local_198[0].m_type = pVVar9->m_type;
          local_198[0].m_flags = pVVar9->m_flags;
          local_1a8 = (VarType *)*plVar5;
        }
        pVVar1 = local_1a8;
        local_1a0 = plVar5[1];
        *plVar5 = (long)pVVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_1c0,&local_25a);
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_258);
        puVar10 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar10) {
          local_208 = *puVar10;
          lStack_200 = plVar5[3];
          local_218 = &local_208;
        }
        else {
          local_208 = *puVar10;
          local_218 = (ulong *)*plVar5;
        }
        local_210 = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        generateCompareSrc(src,local_1b8,pVVar1,(char *)local_218,(char *)local_1c8,local_1d0,
                           (void *)CONCAT44(in_stack_fffffffffffffd9c,(uint)basePtr),
                           in_stack_fffffffffffffda0);
        if (local_218 != &local_208) {
          operator_delete(local_218,local_208 + 1);
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        if (local_1a8 != local_198) {
          operator_delete(local_1a8,local_198[0]._0_8_ + 1);
        }
        if ((long *)local_248._16_8_ != &local_228) {
          operator_delete((void *)local_248._16_8_,local_228 + 1);
        }
        if (local_258 != (VarType *)local_248) {
          operator_delete(local_258,local_248._0_8_ + 1);
        }
        iVar12 = iVar12 + 1;
        if (*(int *)(resultVar + 0x10) <= iVar12) {
          return;
        }
      } while( true );
    }
  }
  pcVar6 = resultVar;
  if (iVar12 == 1) {
    pcVar6 = *(char **)(resultVar + 8);
  }
  pcVar6 = glu::getDataTypeName(*(DataType *)(pcVar6 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,local_1c0,(allocator<char> *)(local_248 + 0x10));
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_1a8 = local_198;
  pVVar9 = (VarType *)(plVar5 + 2);
  if ((VarType *)*plVar5 == pVVar9) {
    local_198[0].m_type = pVVar9->m_type;
    local_198[0].m_flags = pVVar9->m_flags;
    local_198[0].m_data._0_8_ = plVar5[3];
  }
  else {
    local_198[0].m_type = pVVar9->m_type;
    local_198[0].m_flags = pVVar9->m_flags;
    local_1a8 = (VarType *)*plVar5;
  }
  local_1a0 = plVar5[1];
  *plVar5 = (long)pVVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_258 != (VarType *)local_248) {
    operator_delete(local_258,local_248._0_8_ + 1);
  }
  pUVar2 = local_1c8;
  iVar3 = UniformLayout::getUniformIndex(local_1c8,(char *)local_1a8);
  pVVar9 = local_1d8;
  entry = (pUVar2->uniforms).
          super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
          ._M_impl.super__Vector_impl_data._M_start + iVar3;
  iVar3 = (int)src;
  if (iVar12 == 1) {
    if (0 < *(int *)(resultVar + 0x10)) {
      iVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,"\tresult *= compare_",
                   0x13);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear(iVar3 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                       _vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,"(",1);
        if (pVVar9 == (VarType *)0x0) {
          std::ios::clear(iVar3 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                       _vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen((char *)pVVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&src->super_basic_ostream<char,_std::char_traits<char>_>,(char *)pVVar9,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,"[",1);
        poVar8 = (ostream *)std::ostream::operator<<(src,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"], ",3);
        generateValueSrc(src,entry,local_1d0,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,");\n",3);
        iVar12 = iVar12 + 1;
      } while (iVar12 < *(int *)(resultVar + 0x10));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,"\tresult *= compare_",0x13)
    ;
    pVVar9 = local_1d8;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,"(",1);
    if (pVVar9 == (VarType *)0x0) {
      std::ios::clear(iVar3 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar7 = strlen((char *)pVVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,(char *)pVVar9,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
    generateValueSrc(src,entry,local_1d0,0);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,");\n",3);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0]._0_8_ + 1);
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream& src, const char* resultVar, const VarType& type, const char* srcName, const char* apiName, const UniformLayout& layout, const void* basePtr, deUint32 unusedMask)
{
	if (type.isBasicType() || (type.isArrayType() && type.getElementType().isBasicType()))
	{
		// Basic type or array of basic types.
		bool						isArray			= type.isArrayType();
		glu::DataType				elementType		= isArray ? type.getElementType().getBasicType() : type.getBasicType();
		const char*					typeName		= glu::getDataTypeName(elementType);
		std::string					fullApiName		= string(apiName) + (isArray ? "[0]" : ""); // Arrays are always postfixed with [0]
		int							uniformNdx		= layout.getUniformIndex(fullApiName.c_str());
		const UniformLayoutEntry&	entry			= layout.uniforms[uniformNdx];

		if (isArray)
		{
			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
			{
				src << "\tresult *= compare_" << typeName << "(" << srcName << "[" << elemNdx << "], ";
				generateValueSrc(src, entry, basePtr, elemNdx);
				src << ");\n";
			}
		}
		else
		{
			src << "\tresult *= compare_" << typeName << "(" << srcName << ", ";
			generateValueSrc(src, entry, basePtr, 0);
			src << ");\n";
		}
	}
	else if (type.isArrayType())
	{
		const VarType& elementType = type.getElementType();

		for (int elementNdx = 0; elementNdx < type.getArraySize(); elementNdx++)
		{
			std::string op = string("[") + de::toString(elementNdx) + "]";
			generateCompareSrc(src, resultVar, elementType, (string(srcName) + op).c_str(), (string(apiName) + op).c_str(), layout, basePtr, unusedMask);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
		{
			if (memberIter->getFlags() & unusedMask)
				continue; // Skip member.

			string op = string(".") + memberIter->getName();
			generateCompareSrc(src, resultVar, memberIter->getType(), (string(srcName) + op).c_str(), (string(apiName) + op).c_str(), layout, basePtr, unusedMask);
		}
	}
}